

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

void __thiscall
nnad::Matrix<double>::Matrix
          (Matrix<double> *this,int *Lines,int *Columns,
          vector<double,_std::allocator<double>_> *Entries)

{
  ostream *poVar1;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  this->_Lines = *Lines;
  this->_Columns = *Columns;
  std::vector<double,_std::allocator<double>_>::vector(&this->_Matrix,Entries);
  if (this->_Columns * this->_Lines ==
      (int)((ulong)((long)(Entries->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(Entries->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    return;
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Matrix: the size of the input vector does not match the size of the matrix.","");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\x1b[0m",4);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(-10);
}

Assistant:

Matrix(int const& Lines, int const& Columns, std::vector<T> const& Entries):
      _Lines(Lines),
      _Columns(Columns),
      _Matrix(Entries)
    {
      // Check that the size of the Entries match the size of the
      // matrix.
      if (_Lines * _Columns != (int) Entries.size())
        Error("Matrix: the size of the input vector does not match the size of the matrix.");
    }